

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O1

void __thiscall
asio::detail::
reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
::do_assign(reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
            *this)

{
  socket_type local_c;
  
  if ((this->new_socket_).socket_ != -1) {
    if (this->peer_endpoint_ != (basic_endpoint<asio::ip::tcp> *)0x0) {
      ip::basic_endpoint<asio::ip::tcp>::resize(this->peer_endpoint_,this->addrlen_);
    }
    local_c = (this->new_socket_).socket_;
    reactive_socket_service<asio::ip::tcp>::assign
              ((this->peer_->impl_).service_,&(this->peer_->impl_).implementation_,&this->protocol_,
               &local_c,&(this->super_reactor_op).ec_);
    if ((this->super_reactor_op).ec_._M_value == 0) {
      (this->new_socket_).socket_ = -1;
    }
  }
  return;
}

Assistant:

void do_assign()
  {
    if (new_socket_.get() != invalid_socket)
    {
      if (peer_endpoint_)
        peer_endpoint_->resize(addrlen_);
      peer_.assign(protocol_, new_socket_.get(), ec_);
      if (!ec_)
        new_socket_.release();
    }
  }